

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::PathDescriptionSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,PathDescriptionSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  SyntaxNode *node;
  SyntaxNode *local_90;
  size_t index_local;
  PathDescriptionSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->openParen).kind;
    token._2_1_ = (this->openParen).field_0x2;
    token.numFlags.raw = (this->openParen).numFlags.raw;
    token.rawLen = (this->openParen).rawLen;
    token.info = (this->openParen).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    token_00.kind = (this->edgeIdentifier).kind;
    token_00._2_1_ = (this->edgeIdentifier).field_0x2;
    token_00.numFlags.raw = (this->edgeIdentifier).numFlags.raw;
    token_00.rawLen = (this->edgeIdentifier).rawLen;
    token_00.info = (this->edgeIdentifier).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 2:
    local_90 = (SyntaxNode *)0x0;
    if (this != (PathDescriptionSyntax *)0xffffffffffffffd0) {
      local_90 = &(this->inputs).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_90);
    break;
  case 3:
    token_01.kind = (this->polarityOperator).kind;
    token_01._2_1_ = (this->polarityOperator).field_0x2;
    token_01.numFlags.raw = (this->polarityOperator).numFlags.raw;
    token_01.rawLen = (this->polarityOperator).rawLen;
    token_01.info = (this->polarityOperator).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 4:
    token_02.kind = (this->pathOperator).kind;
    token_02._2_1_ = (this->pathOperator).field_0x2;
    token_02.numFlags.raw = (this->pathOperator).numFlags.raw;
    token_02.rawLen = (this->pathOperator).rawLen;
    token_02.info = (this->pathOperator).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_02);
    break;
  case 5:
    node = &not_null<slang::syntax::PathSuffixSyntax_*>::get(&this->suffix)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
    break;
  case 6:
    token_03.kind = (this->closeParen).kind;
    token_03._2_1_ = (this->closeParen).field_0x2;
    token_03.numFlags.raw = (this->closeParen).numFlags.raw;
    token_03.rawLen = (this->closeParen).rawLen;
    token_03.info = (this->closeParen).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_03);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax PathDescriptionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return openParen;
        case 1: return edgeIdentifier;
        case 2: return &inputs;
        case 3: return polarityOperator;
        case 4: return pathOperator;
        case 5: return suffix.get();
        case 6: return closeParen;
        default: return nullptr;
    }
}